

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_strip_synclos_bound(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  sexp kar;
  sexp res;
  sexp kdr;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_30.var = &kar;
  res = (sexp)&DAT_0000043e;
  kar = (sexp)&DAT_0000043e;
  kdr = (sexp)&DAT_0000043e;
  if (0 < depth) {
    local_50.var = &res;
    local_30.next = &local_50;
    local_50.next = (ctx->value).context.saves;
    local_40.next = &local_30;
    local_40.var = &kdr;
    (ctx->value).context.saves = &local_40;
    psVar1 = sexp_id_name(x);
    x = psVar1;
    if (((ulong)psVar1 & 3) == 0) {
      if (psVar1->tag == 6) {
        kar = sexp_strip_synclos_bound(ctx,(psVar1->value).type.name,depth + -1);
        kdr = sexp_strip_synclos_bound(ctx,(psVar1->value).type.cpl,depth + -1);
        x = sexp_cons_op(ctx,(sexp)0x0,2,kar,kdr);
        (x->value).type.slots = (psVar1->value).type.slots;
        x->field_0x5 = x->field_0x5 | 1;
      }
      else if (psVar1->tag == 10) {
        for (psVar3 = (sexp)0x0; psVar3 < (psVar1->value).type.name;
            psVar3 = (sexp)((long)&psVar3->tag + 1)) {
          psVar2 = sexp_strip_synclos_bound
                             (ctx,*(sexp *)((long)&psVar1->value + (long)psVar3 * 8 + 8),depth + -1)
          ;
          *(sexp *)((long)&psVar1->value + (long)psVar3 * 8 + 8) = psVar2;
        }
      }
    }
    (ctx->value).context.saves = local_50.next;
  }
  return x;
}

Assistant:

sexp sexp_strip_synclos_bound (sexp ctx, sexp x, int depth) {
  int i;
  sexp_gc_var3(res, kar, kdr);
  if (depth <= 0) return x;
  sexp_gc_preserve3(ctx, res, kar, kdr);
  x = sexp_id_name(x);
  if (sexp_pairp(x)) {
    kar = sexp_strip_synclos_bound(ctx, sexp_car(x), depth-1);
    kdr = sexp_strip_synclos_bound(ctx, sexp_cdr(x), depth-1);
    res = sexp_cons(ctx, kar, kdr);
    sexp_pair_source(res) = sexp_pair_source(x);
    sexp_immutablep(res) = 1;
  } else {
    if (sexp_vectorp(x))
      for (i = 0; i < sexp_vector_length(x); ++i)
        sexp_vector_set(x, sexp_make_fixnum(i), sexp_strip_synclos_bound(ctx, sexp_vector_ref(x, sexp_make_fixnum(i)), depth-1));
    res = x;
  }
  sexp_gc_release3(ctx);
  return res;
}